

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledI2C.cxx
# Opt level: O0

void __thiscall SSD1306::OledI2C::fillWith(OledI2C *this,uint8_t value)

{
  iterator pvVar1;
  iterator pvVar2;
  value_type_conflict in_SIL;
  iterator byte;
  array<unsigned_char,_33UL> *bytes;
  value_type *block;
  iterator __end1;
  iterator __begin1;
  array<SSD1306::OledI2C::PixelBlock,_32UL> *__range1;
  iterator local_40;
  iterator local_20;
  
  local_20 = std::array<SSD1306::OledI2C::PixelBlock,_32UL>::begin
                       ((array<SSD1306::OledI2C::PixelBlock,_32UL> *)0x108fe8);
  pvVar1 = std::array<SSD1306::OledI2C::PixelBlock,_32UL>::end
                     ((array<SSD1306::OledI2C::PixelBlock,_32UL> *)0x108ff7);
  for (; local_20 != pvVar1; local_20 = local_20 + 1) {
    local_40 = std::array<unsigned_char,_33UL>::begin((array<unsigned_char,_33UL> *)0x10902a);
    while( true ) {
      local_40 = local_40 + 1;
      pvVar2 = std::array<unsigned_char,_33UL>::end((array<unsigned_char,_33UL> *)0x109046);
      if (local_40 == pvVar2) break;
      if ((*local_40 != in_SIL) && (*local_40 = in_SIL, (local_20->dirty_ & 1U) == 0)) {
        local_20->dirty_ = true;
      }
    }
  }
  return;
}

Assistant:

void
SSD1306::OledI2C::fillWith(
    uint8_t value)
{
    for (auto& block : blocks_)
    {
        auto& bytes = block.bytes_;

        for (auto byte = bytes.begin() + SSD1306::OledI2C::DataOffset ; 
             byte != bytes.end() ;
             ++byte)
        {
            if (*byte != value)
            {
                *byte = value;

                if (not block.dirty_)
                {
                    block.dirty_ = true;
                }
            }
        }
    }
}